

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

PC * __thiscall Hpipe::Context::without_mark(PC *__return_storage_ptr__,Context *this)

{
  size_type sVar1;
  CharItem **ppCVar2;
  uint local_ac;
  undefined1 local_a8 [4];
  uint i;
  PcMaker pm;
  Context *this_local;
  
  pm.orig = this;
  anon_unknown_7::PcMaker::PcMaker((PcMaker *)local_a8,this);
  local_ac = 0;
  while( true ) {
    sVar1 = std::vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>::size
                      ((vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_> *)
                       this);
    if (sVar1 <= local_ac) break;
    ppCVar2 = Vec<const_Hpipe::CharItem_*>::operator[](&this->pos,local_ac);
    anon_unknown_7::PcMaker::add((PcMaker *)local_a8,*ppCVar2,local_ac,false);
    local_ac = local_ac + 1;
  }
  pm.res.first.paths_to_strings._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
       (byte)pm.res.first.paths_to_strings._M_t._M_impl.super__Rb_tree_header._M_node_count | 8;
  pm.res.first.pos.super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_7::PcMaker::out(__return_storage_ptr__,(PcMaker *)local_a8);
  anon_unknown_7::PcMaker::~PcMaker((PcMaker *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::without_mark() const { //  const Vec<unsigned> &keep_ind
    PcMaker pm( this );

    //if ( keep_ind.contains( i ) )
    for( unsigned i = 0; i < pos.size(); ++i )
        pm.add( pos[ i ], i, false );

    pm.res.first.flags |= FL_OK;
    pm.res.first.mark = nullptr;
    return pm.out();
}